

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaTrFunc.cpp
# Opt level: O2

bool __thiscall NaTransFunc::Empty(NaTransFunc *this)

{
  uint uVar1;
  
  if (this->ut < utPolyFrac) {
    uVar1 = (this->items).nItems;
  }
  else {
    uVar1 = NaVector::dim(&(this->pf).num);
    if (uVar1 != 0) {
      return false;
    }
    uVar1 = NaVector::dim(&(this->pf).den);
  }
  return uVar1 == 0;
}

Assistant:

bool
NaTransFunc::Empty () const
{
    bool    bFlag;
    switch(ut){
    case utSum:
    case utProduct:
        bFlag = (0 == items.count());
        break;
    case utPolyFrac:
        bFlag = (0 == pf.num.dim() && 0 == pf.den.dim());
        break;
    }
    return bFlag;
}